

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

GeometryShaderExecutor *
deqp::gls::ShaderExecUtil::GeometryShaderExecutor::create
          (RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  ShaderSpec *renderCtx_00;
  bool bVar1;
  GeometryShaderExecutor *this;
  allocator<char> local_39;
  string local_38;
  ShaderSpec *local_18;
  ShaderSpec *shaderSpec_local;
  RenderContext *renderCtx_local;
  
  local_18 = shaderSpec;
  shaderSpec_local = (ShaderSpec *)renderCtx;
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  renderCtx_00 = shaderSpec_local;
  if ((bVar1) && ((int)local_18->version < 3)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_EXT_geometry_shader",&local_39);
    checkExtension((RenderContext *)renderCtx_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  this = (GeometryShaderExecutor *)operator_new(0x158);
  GeometryShaderExecutor(this,(RenderContext *)shaderSpec_local,local_18);
  return this;
}

Assistant:

GeometryShaderExecutor* GeometryShaderExecutor::create (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
{
	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		checkExtension(renderCtx, "GL_EXT_geometry_shader");

	return new GeometryShaderExecutor(renderCtx, shaderSpec);
}